

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Table.cpp
# Opt level: O1

Table * __thiscall Table::assign(Table *this)

{
  long lVar1;
  Table *in_RDI;
  
  in_RDI->current_row = 1;
  in_RDI->current_col = 1;
  in_RDI->table[0][0] = '1';
  in_RDI->table[0][1] = '3';
  in_RDI->table[0][2] = '6';
  in_RDI->table[1][0] = '4';
  in_RDI->table[1][1] = ' ';
  in_RDI->table[1][2] = '2';
  in_RDI->table[2][0] = '7';
  in_RDI->table[2][1] = '5';
  in_RDI->table[2][2].number = '8';
  lVar1 = 0;
  do {
    in_RDI->table[0][lVar1 + 2].number = this->table[0][lVar1 + 2].number;
    *(undefined2 *)(in_RDI->table[0] + lVar1) = *(undefined2 *)(this->table[0] + lVar1);
    lVar1 = lVar1 + 3;
  } while (lVar1 != 9);
  return in_RDI;
}

Assistant:

Table Table::assign() {
    Table table = Table();
    for (int i = 0; i < HEIGHT; i++){
        for (int j = 0; j < WIDTH; j++) {
            table.table[i][j] = this->table[i][j];
        }
    }
    return table;
}